

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O1

Clause * __thiscall
Inferences::DuplicateLiteralRemovalISE::simplify(DuplicateLiteralRemovalISE *this,Clause *c)

{
  Literal *pLVar1;
  uint uVar2;
  bool bVar3;
  Literal **ppLVar4;
  Literal **ppLVar5;
  ulong uVar6;
  Clause *pCVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  Literal **ppLVar11;
  Literal *pLVar12;
  int iVar13;
  Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> resLits;
  Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_80;
  SimplifyingInference1 local_70;
  Inference local_60;
  
  uVar8 = *(uint *)&c->field_0x38 & 0xfffff;
  uVar10 = (ulong)uVar8;
  if (uVar8 < 2) {
    return c;
  }
  if (simplify(Kernel::Clause*)::skipped == '\0') {
    simplify();
  }
  simplify::skipped._cursor = simplify::skipped._stack;
  if (uVar8 == 3) {
    pLVar1 = c->_literals[0];
    if (pLVar1 == *(Literal **)&c[1].super_Unit) {
      if (simplify::skipped._stack == simplify::skipped._end) {
        ::Lib::Stack<Kernel::Literal_*>::expand(&simplify::skipped);
      }
      *simplify::skipped._cursor = pLVar1;
      simplify::skipped._cursor = simplify::skipped._cursor + 1;
      pLVar12 = c->_literals[0];
      if (pLVar12 != *(Literal **)&c[1].super_Unit._inference) goto LAB_004fcad0;
    }
    else {
      pLVar12 = *(Literal **)&c[1].super_Unit._inference;
      if (pLVar1 != pLVar12 && *(Literal **)&c[1].super_Unit != pLVar12) {
        simplify::skipped._cursor = simplify::skipped._stack;
        return c;
      }
    }
  }
  else {
    if (uVar8 != 2) {
      if (simplify(Kernel::Clause*)::seen == '\0') {
        simplify();
      }
      ::Lib::DHMap<Kernel::Literal_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
                (&simplify::seen._map);
      uVar9 = *(uint *)&c->field_0x38 & 0xfffff;
      if (uVar9 != 0) {
        uVar6 = (ulong)(uVar9 != 0);
        ppLVar4 = c->_literals;
        ppLVar5 = c->_literals + uVar6;
        do {
          pLVar1 = *ppLVar4;
          bVar3 = ::Lib::
                  DHMap<Kernel::Literal_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::
                  insert(&simplify::seen._map,pLVar1);
          if (!bVar3) {
            if (simplify::skipped._cursor == simplify::skipped._end) {
              ::Lib::Stack<Kernel::Literal_*>::expand(&simplify::skipped);
            }
            *simplify::skipped._cursor = pLVar1;
            simplify::skipped._cursor = simplify::skipped._cursor + 1;
          }
          uVar2 = (uint)uVar6;
          ppLVar11 = ppLVar5 + 1;
          if (uVar9 <= uVar2) {
            ppLVar5 = (Literal **)0x0;
          }
          uVar6 = (ulong)(uVar2 + 1);
          ppLVar4 = ppLVar5;
          ppLVar5 = ppLVar11;
        } while (uVar2 < uVar9);
      }
      if (simplify::skipped._cursor == simplify::skipped._stack) {
        return c;
      }
      goto LAB_004fcad0;
    }
    pLVar12 = c->_literals[0];
    if (pLVar12 != *(Literal **)&c[1].super_Unit) {
      simplify::skipped._cursor = simplify::skipped._stack;
      return c;
    }
  }
  if (simplify::skipped._cursor == simplify::skipped._end) {
    ::Lib::Stack<Kernel::Literal_*>::expand(&simplify::skipped);
  }
  *simplify::skipped._cursor = pLVar12;
  simplify::skipped._cursor = simplify::skipped._cursor + 1;
LAB_004fcad0:
  iVar13 = (int)((ulong)((long)simplify::skipped._cursor - (long)simplify::skipped._stack) >> 3);
  uVar8 = uVar8 - iVar13;
  ::Lib::Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled(&local_80);
  ::Lib::DArray<Kernel::Literal_*>::ensure
            ((DArray<Kernel::Literal_*> *)
             local_80._self._M_t.
             super___uniq_ptr_impl<Lib::DArray<Kernel::Literal_*>,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::DArray<Kernel::Literal_*>_*,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
             .super__Head_base<0UL,_Lib::DArray<Kernel::Literal_*>_*,_false>._M_head_impl,
             (long)(int)uVar8);
  if (0 < (int)uVar8) {
    uVar6 = (ulong)uVar8;
    do {
      uVar9 = (int)uVar10 - 1;
      uVar10 = (ulong)uVar9;
      if (simplify::skipped._cursor != simplify::skipped._stack) {
        uVar10 = (ulong)(int)uVar9;
        do {
          ppLVar4 = simplify::skipped._cursor + -1;
          if (c->_literals[uVar10] != *ppLVar4) break;
          uVar10 = uVar10 - 1;
          simplify::skipped._cursor = ppLVar4;
        } while (ppLVar4 != simplify::skipped._stack);
      }
      (*(Literal ***)
        ((long)local_80._self._M_t.
               super___uniq_ptr_impl<Lib::DArray<Kernel::Literal_*>,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::DArray<Kernel::Literal_*>_*,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
               .super__Head_base<0UL,_Lib::DArray<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10))
      [uVar6 - 1] = c->_literals[(int)uVar10];
      bVar3 = 1 < (long)uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar3);
  }
  *(int *)(DAT_00b7e1c0 + 0x138) = *(int *)(DAT_00b7e1c0 + 0x138) + iVar13;
  ppLVar4 = *(Literal ***)
             ((long)local_80._self._M_t.
                    super___uniq_ptr_impl<Lib::DArray<Kernel::Literal_*>,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::DArray<Kernel::Literal_*>_*,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
                    .super__Head_base<0UL,_Lib::DArray<Kernel::Literal_*>_*,_false>._M_head_impl +
             0x10);
  local_70.rule = REMOVE_DUPLICATE_LITERALS;
  local_70.premise = c;
  Kernel::Inference::Inference(&local_60,&local_70);
  pCVar7 = Kernel::Clause::fromArray(ppLVar4,uVar8,&local_60);
  ::Lib::Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_80);
  return pCVar7;
}

Assistant:

Clause* DuplicateLiteralRemovalISE::simplify(Clause* c)
{
  int length = c->length();
  if (length <= 1) {
    return c;
  }

  //literals that will be skipped, skipping starts on the top of the stack
  //and goes from the end of the clause
  static LiteralStack skipped;
  skipped.reset();

  //we handle low length specially, not to have to use the set
  if(length==2) {
    if((*c)[0]!=(*c)[1]) {
      return c;
    }
    skipped.push((*c)[0]);
  }
  else if(length==3) {
    if((*c)[0]!=(*c)[1]) {
      if((*c)[0]!=(*c)[2]) {
        if((*c)[1]!=(*c)[2]) {
          return c;
        }
      }
      skipped.push((*c)[2]);
    }
    else { //(*c)[0]==(*c)[1]
      skipped.push((*c)[0]);
      if((*c)[0]==(*c)[2]) {
        //all are equal
        skipped.push((*c)[0]);
      }
    }
  }
  else {
    static DHSet<Literal*> seen;
    seen.reset();
    //here we rely on the fact that the iterator traverses the clause from
    //the first to the last literal
    for (Literal* lit : c->iterLits()) {
      if(!seen.insert(lit)) {
        skipped.push(lit);
      }
    }
    if(skipped.isEmpty()) {
      return c;
    }
  }

  ASS(skipped.isNonEmpty());

  // there are duplicate literals, delete them from lits
  int newLength = length - skipped.length();
  // now lits[0 ... newLength-1] contain the remaining literals
  Recycled<DArray<Literal*>> resLits;
  resLits->ensure(newLength);

  int origIdx = length-1;

  for(int newIdx=newLength-1; newIdx>=0; newIdx--,origIdx--) {
    while(skipped.isNonEmpty() && (*c)[origIdx]==skipped.top()) {
      skipped.pop();
      origIdx--;
      ASS_GE(origIdx,0);
    }
    (*resLits)[newIdx] = (*c)[origIdx];
  }
  ASS(skipped.isEmpty());
  ASS_EQ(origIdx,-1);
  env.statistics->duplicateLiterals += length - newLength;

#if DEBUG_DUPLICATE_LITERALS
  {
    static DHSet<Literal*> origLits;
    origLits.reset();
    static DHSet<Literal*> newLits;
    newLits.reset();
    origLits.loadFromIterator(c->iterLits());
    newLits.loadFromIterator(d->iterLits());
    ASS_EQ(origLits.size(),newLits.size());
    ASS_EQ(origLits.size(), static_cast<unsigned>(newLength));
  }
#endif

  return Clause::fromArray(resLits->begin(), newLength,
			 SimplifyingInference1(InferenceRule::REMOVE_DUPLICATE_LITERALS,c));
}